

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

bool __thiscall R2Rect::Intersects(R2Rect *this,R2Rect *other)

{
  double dVar1;
  R2Rect *pRVar2;
  bool bVar3;
  double dVar4;
  
  dVar1 = this->bounds_[0].bounds_.c_[0];
  dVar4 = other->bounds_[0].bounds_.c_[0];
  if (dVar1 <= dVar4) {
    pRVar2 = other;
    if (this->bounds_[0].bounds_.c_[1] < dVar4) {
      return false;
    }
  }
  else {
    pRVar2 = this;
    dVar4 = dVar1;
    if (other->bounds_[0].bounds_.c_[1] < dVar1) {
      return false;
    }
  }
  if (dVar4 <= pRVar2->bounds_[0].bounds_.c_[1]) {
    dVar1 = this->bounds_[1].bounds_.c_[0];
    dVar4 = other->bounds_[1].bounds_.c_[0];
    if (dVar1 <= dVar4) {
      if (dVar4 <= this->bounds_[1].bounds_.c_[1]) {
        bVar3 = other->bounds_[1].bounds_.c_[1] < dVar4;
        goto LAB_0019c3f8;
      }
    }
    else if (dVar1 <= other->bounds_[1].bounds_.c_[1]) {
      bVar3 = this->bounds_[1].bounds_.c_[1] < dVar1;
LAB_0019c3f8:
      return !bVar3;
    }
  }
  return false;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }